

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentQLearner.cpp
# Opt level: O1

void __thiscall AgentQLearner::AgentQLearner(AgentQLearner *this,AgentQLearner *a)

{
  _func_int *p_Var1;
  double dVar2;
  Index IVar3;
  
  p_Var1 = (a->super_AgentFullyObservable)._vptr_AgentFullyObservable[-3];
  *(undefined ***)&this->field_0x80 = &PTR__SimulationAgent_005a8538;
  *(undefined4 *)&this->field_0x88 =
       *(undefined4 *)(&(a->super_AgentFullyObservable).field_0x8 + (long)p_Var1);
  this->field_0x8c = (&(a->super_AgentFullyObservable).field_0xc)[(long)p_Var1];
  *(undefined ***)&this->field_0x80 = &PTR__SimulationAgent_005a84e8;
  *(undefined8 *)&this->field_0x90 =
       *(undefined8 *)(&(a->super_AgentFullyObservable).field_0x10 + (long)p_Var1);
  (this->super_AgentFullyObservable)._vptr_AgentFullyObservable = (_func_int **)0x5a8df0;
  *(undefined8 *)&this->field_0x80 = 0x5a8e58;
  QTable::QTable((QTable *)&(this->super_AgentFullyObservable).field_0x8,
                 (QTable *)&(a->super_AgentFullyObservable).field_0x8);
  IVar3 = a->_m_prevSI;
  this->_m_selJaI = a->_m_selJaI;
  this->_m_prevSI = IVar3;
  dVar2 = a->_m_gamma;
  this->_m_alpha = a->_m_alpha;
  this->_m_gamma = dVar2;
  this->_m_initValue = a->_m_initValue;
  this->_m_exploration = a->_m_exploration;
  dVar2 = a->_m_temp;
  this->_m_epsilon = a->_m_epsilon;
  this->_m_temp = dVar2;
  this->_m_t = a->_m_t;
  this->_m_firstAgent = a->_m_firstAgent;
  return;
}

Assistant:

AgentQLearner::AgentQLearner(const AgentQLearner& a) :
    AgentDecPOMDPDiscrete(a),
    AgentFullyObservable(a),
    _m_Q(a._m_Q),
    _m_selJaI(a._m_selJaI),
    _m_prevSI(a._m_prevSI),
    _m_alpha(a._m_alpha),
    _m_gamma(a._m_gamma),
    _m_initValue(a._m_initValue),
    _m_exploration(a._m_exploration),
    _m_epsilon(a._m_epsilon),
    _m_temp(a._m_temp),
    _m_firstAgent(a._m_firstAgent),
    _m_t(a._m_t)
{
}